

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O3

void __thiscall HMISong::SetupForHMI(HMISong *this,int len)

{
  short sVar1;
  int iVar2;
  int iVar3;
  BYTE *pBVar4;
  TrackInfo *pTVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  this->ReadVarLen = ReadVarLenHMI;
  pBVar4 = this->MusHeader;
  sVar1 = *(short *)(pBVar4 + 0xe4);
  uVar9 = (uint)sVar1;
  this->NumTracks = uVar9;
  if (0 < sVar1) {
    (this->super_MIDIStreamer).Division = (int)*(short *)(pBVar4 + 0xd4) << 2;
    (this->super_MIDIStreamer).InitialTempo = 4000000;
    pTVar5 = (TrackInfo *)operator_new__((ulong)(uVar9 * 0x38 + 0x38));
    this->Tracks = pTVar5;
    iVar2 = *(int *)(pBVar4 + 0xe8);
    uVar8 = 0;
    iVar6 = 0;
    do {
      iVar3 = *(int *)(pBVar4 + uVar8 * 4 + (long)iVar2);
      lVar10 = (long)iVar3;
      if ((iVar3 <= len + -0x9d) &&
         (*(long *)(pBVar4 + lVar10 + 5) == 0x4b43415254494449 &&
          *(long *)(pBVar4 + lVar10) == 0x4944494d2d494d48)) {
        iVar7 = len;
        if (uVar8 != uVar9 - 1) {
          iVar7 = *(int *)(pBVar4 + uVar8 * 4 + (long)iVar2 + 4);
        }
        iVar11 = len - iVar3;
        if (iVar7 - iVar3 < len - iVar3) {
          iVar11 = iVar7 - iVar3;
        }
        if (0 < iVar11) {
          iVar3 = *(int *)(pBVar4 + lVar10 + 0x57);
          if (iVar11 - iVar3 != 0 && iVar3 <= iVar11) {
            pTVar5[iVar6].TrackBegin = pBVar4 + iVar3 + lVar10;
            pTVar5[iVar6].TrackP = 0;
            pTVar5[iVar6].MaxTrackP = (ulong)(uint)(iVar11 - iVar3);
            lVar12 = 0;
            do {
              pTVar5[iVar6].Designation[lVar12] = *(WORD *)(pBVar4 + lVar12 * 2 + lVar10 + 0x99);
              lVar12 = lVar12 + 1;
            } while (lVar12 != 8);
            iVar6 = iVar6 + 1;
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar9);
    this->NumTracks = iVar6;
  }
  return;
}

Assistant:

void HMISong::SetupForHMI(int len)
{
	int i, p;

	ReadVarLen = ReadVarLenHMI;
	NumTracks = GetShort(MusHeader + HMI_TRACK_COUNT_OFFSET);

	if (NumTracks <= 0)
	{
		return;
	}

	// The division is the number of pulses per quarter note (PPQN).
	// HMI files have two values here, a full value and a quarter value. Some games, 
	// notably Quarantines, have identical values for some reason, so it's safer to
	// use the quarter value and multiply it by four than to trust the full value.
	Division = GetShort(MusHeader + HMI_DIVISION_OFFSET) << 2;
	InitialTempo = 4000000;

	Tracks = new TrackInfo[NumTracks + 1];
	int track_dir = GetInt(MusHeader + HMI_TRACK_DIR_PTR_OFFSET);

	// Gather information about each track
	for (i = 0, p = 0; i < NumTracks; ++i)
	{
		int start = GetInt(MusHeader + track_dir + i*4);
		int tracklen, datastart;

		if (start > len - HMITRACK_DESIGNATION_OFFSET - 4)
		{ // Track is incomplete.
			continue;
		}

		// BTW, HMI does not actually check the track header.
		if (memcmp(MusHeader + start, TRACK_MAGIC, 13) != 0)
		{
			continue;
		}

		// The track ends where the next one begins. If this is the
		// last track, then it ends at the end of the file.
		if (i == NumTracks - 1)
		{
			tracklen = len - start;
		}
		else
		{
			tracklen = GetInt(MusHeader + track_dir + i*4 + 4) - start;
		}
		// Clamp incomplete tracks to the end of the file.
		tracklen = MIN(tracklen, len - start);
		if (tracklen <= 0)
		{
			continue;
		}

		// Offset to actual MIDI events.
		datastart = GetInt(MusHeader + start + HMITRACK_DATA_PTR_OFFSET);
		tracklen -= datastart;
		if (tracklen <= 0)
		{
			continue;
		}

		// Store track information
		Tracks[p].TrackBegin = MusHeader + start + datastart;
		Tracks[p].TrackP = 0;
		Tracks[p].MaxTrackP = tracklen;

		// Retrieve track designations. We can't check them yet, since we have not yet
		// connected to the MIDI device.
		for (int ii = 0; ii < NUM_HMI_DESIGNATIONS; ++ii)
		{
			Tracks[p].Designation[ii] = GetShort(MusHeader + start + HMITRACK_DESIGNATION_OFFSET + ii*2);
		}

		p++;
	}

	// In case there were fewer actual chunks in the file than the
	// header specified, update NumTracks with the current value of p.
	NumTracks = p;
}